

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fBasicComputeShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_2::SSBOLocalBarrierCase::SSBOLocalBarrierCase
          (SSBOLocalBarrierCase *this,Context *context,char *name,char *description,IVec3 *localSize
          ,IVec3 *workSize)

{
  IVec3 *workSize_local;
  IVec3 *localSize_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  SSBOLocalBarrierCase *this_local;
  
  gles31::TestCase::TestCase(&this->super_TestCase,context,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SSBOLocalBarrierCase_032c0978;
  tcu::Vector<int,_3>::Vector(&this->m_localSize,localSize);
  tcu::Vector<int,_3>::Vector(&this->m_workSize,workSize);
  return;
}

Assistant:

SSBOLocalBarrierCase (Context& context, const char* name, const char* description, const tcu::IVec3& localSize, const tcu::IVec3& workSize)
		: TestCase		(context, name, description)
		, m_localSize	(localSize)
		, m_workSize	(workSize)
	{
	}